

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::iterate
          (TextureBorderClampPerAxisCase3D *this)

{
  undefined1 local_bc [8];
  ReferenceParams samplerParams;
  Surface renderedFrame;
  TextureBorderClampPerAxisCase3D *this_local;
  
  tcu::Surface::Surface((Surface *)&samplerParams.baseLevel,0x80,0x80);
  getSamplerParams((ReferenceParams *)local_bc,this);
  logParams(this,(ReferenceParams *)local_bc);
  renderTo(this,(Surface *)&samplerParams.baseLevel,(ReferenceParams *)local_bc);
  verifyImage(this,(Surface *)&samplerParams.baseLevel,(ReferenceParams *)local_bc);
  tcu::Surface::~Surface((Surface *)&samplerParams.baseLevel);
  return STOP;
}

Assistant:

TextureBorderClampPerAxisCase3D::IterateResult TextureBorderClampPerAxisCase3D::iterate (void)
{
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= getSamplerParams();

	logParams(samplerParams);
	renderTo(renderedFrame, samplerParams);
	verifyImage(renderedFrame, samplerParams);

	return STOP;
}